

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O3

TRIPLEYCbCr ** __thiscall
MovingAveradgeFilter::apply_filter
          (MovingAveradgeFilter *this,TRIPLEYCbCr **mrx,int h,int w,int radius,double sigma)

{
  undefined1 auVar1 [16];
  TRIPLEYCbCr **mrxf;
  ulong uVar2;
  TRIPLEYCbCr *this_00;
  int row;
  ulong uVar3;
  int iVar4;
  
  this_00 = (TRIPLEYCbCr *)((ulong)(uint)h * 8);
  if (h < 0) {
    this_00 = (TRIPLEYCbCr *)0xffffffffffffffff;
  }
  mrxf = (TRIPLEYCbCr **)operator_new__((ulong)this_00);
  if (0 < h) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)w;
    uVar2 = SUB168(auVar1 * ZEXT816(3),0);
    if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    uVar3 = 0;
    do {
      this_00 = (TRIPLEYCbCr *)operator_new__(uVar2);
      mrxf[uVar3] = this_00;
      memset(this_00,0,(long)w * 3);
      uVar3 = uVar3 + 1;
    } while ((uint)h != uVar3);
  }
  if (radius < h - radius) {
    row = radius;
    do {
      if (radius < w - radius) {
        iVar4 = 0;
        do {
          moving_averadge((MovingAveradgeFilter *)this_00,mrxf,mrx,row,radius + iVar4,radius);
          iVar4 = iVar4 + 1;
        } while (w + radius * -2 != iVar4);
      }
      row = row + 1;
    } while (row != h - radius);
  }
  return mrxf;
}

Assistant:

TRIPLEYCbCr **MovingAveradgeFilter::apply_filter(TRIPLEYCbCr **mrx, int h, int w, int radius, double sigma) {
    TRIPLEYCbCr **mrxf = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxf[i] = new TRIPLEYCbCr[w];
        memset(mrxf[i], 0, sizeof(TRIPLEYCbCr) * w);
    }
    for (int i = radius; i < h - radius; i++) {
        for (int j = radius; j < w - radius; j++) {
            moving_averadge(&mrxf[0], mrx, i, j, radius);
        }
    }
    return mrxf;
}